

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDup.c
# Opt level: O1

Aig_Obj_t * Aig_ManDupDfsGuided_rec(Aig_Man_t *pNew,Aig_Man_t *p,Aig_Obj_t *pObj)

{
  Aig_Obj_t **ppAVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  ulong uVar4;
  Aig_Obj_t *p1;
  
  if ((Aig_Obj_t *)(pObj->field_5).pData != (Aig_Obj_t *)0x0) {
    return (Aig_Obj_t *)(pObj->field_5).pData;
  }
  if ((*(uint *)&pObj->field_0x18 & 7) != 2) {
    ppAVar1 = p->pEquivs;
    if ((ppAVar1 == (Aig_Obj_t **)0x0) || (ppAVar1[pObj->Id] == (Aig_Obj_t *)0x0)) {
      pAVar2 = (Aig_Obj_t *)0x0;
    }
    else {
      pAVar2 = Aig_ManDupDfsGuided_rec(pNew,p,ppAVar1[pObj->Id]);
    }
    pAVar3 = Aig_ManDupDfsGuided_rec
                       (pNew,p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
    if (pAVar3 != (Aig_Obj_t *)0x0) {
      if ((*(uint *)&pObj->field_0x18 & 7) == 4) {
        if (((ulong)pObj & 1) != 0) {
LAB_00627e4f:
          __assert_fail("!Aig_IsComplement(pObj)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                        ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
        }
        uVar4 = (ulong)pObj->pFanin0 & 0xfffffffffffffffe;
        if (uVar4 == 0) {
          pAVar3 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar3 = (Aig_Obj_t *)((ulong)((uint)pObj->pFanin0 & 1) ^ *(ulong *)(uVar4 + 0x28));
        }
      }
      else {
        pAVar3 = Aig_ManDupDfsGuided_rec
                           (pNew,p,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe));
        if (pAVar3 == (Aig_Obj_t *)0x0) {
          return (Aig_Obj_t *)0x0;
        }
        if (((ulong)pObj & 1) != 0) goto LAB_00627e4f;
        uVar4 = (ulong)pObj->pFanin0 & 0xfffffffffffffffe;
        if (uVar4 == 0) {
          pAVar3 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar3 = (Aig_Obj_t *)((ulong)((uint)pObj->pFanin0 & 1) ^ *(ulong *)(uVar4 + 0x28));
        }
        uVar4 = (ulong)pObj->pFanin1 & 0xfffffffffffffffe;
        if (uVar4 == 0) {
          p1 = (Aig_Obj_t *)0x0;
        }
        else {
          p1 = (Aig_Obj_t *)((ulong)((uint)pObj->pFanin1 & 1) ^ *(ulong *)(uVar4 + 0x28));
        }
        pAVar3 = Aig_Oper(pNew,pAVar3,p1,*(Aig_Type_t *)&pObj->field_0x18 & AIG_OBJ_VOID);
        if (pAVar2 != (Aig_Obj_t *)0x0) {
          if (pNew->pEquivs != (Aig_Obj_t **)0x0) {
            pNew->pEquivs[*(int *)(((ulong)pAVar3 & 0xfffffffffffffffe) + 0x24)] =
                 (Aig_Obj_t *)((ulong)pAVar2 & 0xfffffffffffffffe);
          }
          if (pNew->pReprs != (Aig_Obj_t **)0x0) {
            pNew->pReprs[*(int *)(((ulong)pAVar2 & 0xfffffffffffffffe) + 0x24)] =
                 (Aig_Obj_t *)((ulong)pAVar3 & 0xfffffffffffffffe);
          }
        }
      }
      (pObj->field_5).pData = pAVar3;
      return pAVar3;
    }
  }
  return (Aig_Obj_t *)0x0;
}

Assistant:

Aig_Obj_t * Aig_ManDupDfsGuided_rec( Aig_Man_t * pNew, Aig_Man_t * p, Aig_Obj_t * pObj )
{
    Aig_Obj_t * pObjNew, * pEquivNew = NULL;
    if ( pObj->pData )
        return (Aig_Obj_t *)pObj->pData;
    if ( Aig_ObjIsCi(pObj) )
        return NULL;
    if ( p->pEquivs && Aig_ObjEquiv(p, pObj) )
        pEquivNew = Aig_ManDupDfsGuided_rec( pNew, p, Aig_ObjEquiv(p, pObj) );
    if ( !Aig_ManDupDfsGuided_rec( pNew, p, Aig_ObjFanin0(pObj) ) )
        return NULL;
    if ( Aig_ObjIsBuf(pObj) )
        return (Aig_Obj_t *)(pObj->pData = Aig_ObjChild0Copy(pObj));
    if ( !Aig_ManDupDfsGuided_rec( pNew, p, Aig_ObjFanin1(pObj) ) )
        return NULL;
    pObjNew = Aig_Oper( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj), Aig_ObjType(pObj) );
    if ( pEquivNew )
    {
        if ( pNew->pEquivs )
            pNew->pEquivs[Aig_Regular(pObjNew)->Id] = Aig_Regular(pEquivNew);        
        if ( pNew->pReprs )
            pNew->pReprs[Aig_Regular(pEquivNew)->Id] = Aig_Regular(pObjNew);
    }
    return (Aig_Obj_t *)(pObj->pData = pObjNew);
}